

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

Vec_Str_t *
Bmc_CollapseOneOld2(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  ulong uVar1;
  char *__ptr;
  uint uVar2;
  Vec_Str_t *__ptr_00;
  Vec_Str_t *pVVar3;
  int iVar4;
  long lVar5;
  Vec_Str_t *pVVar6;
  int iVar7;
  
  __ptr_00 = Bmc_CollapseOneInt2(p,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose,0);
  if (__ptr_00 == (Vec_Str_t *)0x0) {
    iVar7 = 1000000000;
  }
  else if ((long)__ptr_00->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar5 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(__ptr_00->pArray[lVar5] == '\n');
      lVar5 = lVar5 + 1;
    } while (__ptr_00->nSize != lVar5);
  }
  iVar4 = p->vCos->nSize;
  if (p->nRegs < iVar4) {
    if (iVar4 < 1) {
LAB_00584eee:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar4 = *p->vCos->pArray;
    lVar5 = (long)iVar4;
    if ((lVar5 < 0) || (p->nObjs <= iVar4)) {
LAB_00584eb0:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar1 = *(ulong *)(p->pObjs + lVar5);
    uVar2 = (uint)uVar1;
    if (((int)uVar2 < 0) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
      *(ulong *)(p->pObjs + lVar5) = uVar1 ^ 0x20000000;
      if (iVar7 <= nCubeLim) {
        nCubeLim = iVar7;
      }
      pVVar3 = Bmc_CollapseOneInt2(p,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose,1);
      iVar4 = p->vCos->nSize;
      if (iVar4 <= p->nRegs) goto LAB_00584ecf;
      if (iVar4 < 1) goto LAB_00584eee;
      iVar4 = *p->vCos->pArray;
      lVar5 = (long)iVar4;
      if ((lVar5 < 0) || (p->nObjs <= iVar4)) goto LAB_00584eb0;
      uVar1 = *(ulong *)(p->pObjs + lVar5);
      uVar2 = (uint)uVar1;
      if (((int)uVar2 < 0) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
        *(ulong *)(p->pObjs + lVar5) = uVar1 ^ 0x20000000;
        if (pVVar3 == (Vec_Str_t *)0x0) {
          iVar4 = 1000000000;
        }
        else if ((long)pVVar3->nSize < 1) {
          iVar4 = 0;
        }
        else {
          lVar5 = 0;
          iVar4 = 0;
          do {
            iVar4 = iVar4 + (uint)(pVVar3->pArray[lVar5] == '\n');
            lVar5 = lVar5 + 1;
          } while (pVVar3->nSize != lVar5);
        }
        pVVar6 = pVVar3;
        if ((__ptr_00 != (Vec_Str_t *)0x0) && (pVVar6 = __ptr_00, pVVar3 != (Vec_Str_t *)0x0)) {
          if (iVar4 < iVar7) {
            __ptr = __ptr_00->pArray;
            pVVar6 = pVVar3;
          }
          else {
            __ptr = pVVar3->pArray;
            __ptr_00 = pVVar3;
          }
          if (__ptr != (char *)0x0) {
            free(__ptr);
            __ptr_00->pArray = (char *)0x0;
          }
          free(__ptr_00);
        }
        return pVVar6;
      }
    }
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
  }
LAB_00584ecf:
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld2( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    Vec_Str_t * vSopOn, * vSopOff;
    int nCubesOn = ABC_INFINITY;
    int nCubesOff = ABC_INFINITY;
    vSopOn = Bmc_CollapseOneInt2( p, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose, 0 );
    if ( vSopOn )
        nCubesOn = Vec_StrCountEntry(vSopOn,'\n');
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    vSopOff = Bmc_CollapseOneInt2( p, Abc_MinInt(nCubeLim, nCubesOn), nBTLimit, fCanon, fReverse, fVerbose, 1 );
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    if ( vSopOff )
        nCubesOff = Vec_StrCountEntry(vSopOff,'\n');
    if ( vSopOn == NULL )
        return vSopOff;
    if ( vSopOff == NULL )
        return vSopOn;
    if ( nCubesOn <= nCubesOff )
    {
        Vec_StrFree( vSopOff );
        return vSopOn;
    }
    else
    {
        Vec_StrFree( vSopOn );
        return vSopOff;
    }
}